

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-misc.c
# Opt level: O2

void do_cmd_time(void)

{
  ulong uVar1;
  long lVar2;
  char cVar3;
  int iVar4;
  char cVar5;
  uint uVar6;
  char *pcVar7;
  
  uVar6 = (uint)z_info->day_length * 10;
  iVar4 = turn % (int)uVar6 + (uVar6 >> 2);
  uVar1 = (long)(iVar4 * 0x18) / (long)(int)uVar6;
  lVar2 = (long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) % 0x18;
  cVar3 = (char)lVar2 % '\f';
  cVar5 = '\f';
  if (cVar3 != '\0') {
    cVar5 = cVar3;
  }
  uVar1 = (long)(iVar4 * 0x5a0) / (long)(int)uVar6;
  pcVar7 = "PM";
  if ((int)lVar2 < 0xc) {
    pcVar7 = "AM";
  }
  msg("This is day %d. The time is %d:%02d %s.",(ulong)(turn / (int)uVar6 + 1),
      (ulong)(uint)(int)cVar5,
      (long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) % 0x3c & 0xffffffff,
      pcVar7);
  return;
}

Assistant:

void do_cmd_time(void)
{
	int32_t len = 10L * z_info->day_length;
	int32_t tick = turn % len + len / 4;

	int day = turn / len + 1;
	int hour = (24 * tick / len) % 24;
	int min = (1440 * tick / len) % 60;


	/* Message */
	msg("This is day %d. The time is %d:%02d %s.", day,
		(hour % 12 == 0) ? 12 : (hour % 12), min,
		(hour < 12) ? "AM" : "PM");
}